

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O2

void test_interpolation_23(void)

{
  run("each part of a dotted name should resolve only against its parent",
      "\"{{a.b.c.name}}\" == \"\"","{\"a\": {\"b\": {}}, \"c\": {\"name\": \"Jim\"}}",(char *)0x0,
      "\"\" == \"\"");
  return;
}

Assistant:

static void
test_interpolation_23(void)
{
    run(
        "each part of a dotted name should resolve only against its parent",
        "\"{{a.b.c.name}}\" == \"\"",
        "{\"a\": {\"b\": {}}, \"c\": {\"name\": \"Jim\"}}",
        NULL,
        "\"\" == \"\""
    );
}